

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_peer_eviction_tests.cpp
# Opt level: O2

void net_peer_eviction_tests::peer_protection_test_invoker(void)

{
  long lVar1;
  unit_test_log_t *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_wrap_stringstream<char> *this;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  pointer local_690;
  pointer local_688;
  char *local_680;
  char *local_678;
  pointer local_670;
  pointer local_668;
  char *local_660;
  char *local_658;
  pointer local_650;
  pointer local_648;
  char *local_640;
  char *local_638;
  pointer local_630;
  pointer local_628;
  char *local_620;
  char *local_618;
  pointer local_610;
  pointer local_608;
  char *local_600;
  char *local_5f8;
  basic_wrap_stringstream<char> local_5f0;
  peer_protection_test t;
  
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_600 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_eviction_tests.cpp"
  ;
  local_5f8 = "";
  memset((basic_wrap_stringstream<char> *)&t,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream((basic_wrap_stringstream<char> *)&t)
  ;
  std::operator<<((ostream *)&t,'\"');
  std::operator<<((ostream *)&t,"peer_protection_test");
  std::operator<<((ostream *)&t,"\" fixture ctor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_((basic_wrap_stringstream<char> *)&t)
  ;
  local_610 = (pbVar3->_M_dataplus)._M_p;
  local_608 = local_610 + pbVar3->_M_string_length;
  file.m_end = (iterator)0x3e;
  file.m_begin = (iterator)&local_600;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file,(size_t)&local_610,msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)&t);
  peer_protection_test::peer_protection_test(&t);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_620 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_eviction_tests.cpp"
  ;
  local_618 = "";
  memset(&local_5f0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_5f0);
  std::operator<<((ostream *)&local_5f0,'\"');
  std::operator<<((ostream *)&local_5f0,"peer_protection_test");
  std::operator<<((ostream *)&local_5f0,"\" fixture setup");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_5f0);
  local_630 = (pbVar3->_M_dataplus)._M_p;
  local_628 = local_630 + pbVar3->_M_string_length;
  file_00.m_end = (iterator)0x3e;
  file_00.m_begin = (iterator)&local_620;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_00,(size_t)&local_630,msg_00);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_5f0);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_640 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_eviction_tests.cpp"
  ;
  local_638 = "";
  memset(&local_5f0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_5f0);
  std::operator<<((ostream *)&local_5f0,'\"');
  std::operator<<((ostream *)&local_5f0,"peer_protection_test");
  std::operator<<((ostream *)&local_5f0,"\" test entry");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_5f0);
  local_650 = (pbVar3->_M_dataplus)._M_p;
  local_648 = local_650 + pbVar3->_M_string_length;
  file_01.m_end = (iterator)0x3e;
  file_01.m_begin = (iterator)&local_640;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_01,(size_t)&local_650,msg_01);
  this = &local_5f0;
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(this);
  peer_protection_test::test_method((peer_protection_test *)this);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_660 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_eviction_tests.cpp"
  ;
  local_658 = "";
  memset(&local_5f0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_5f0);
  std::operator<<((ostream *)&local_5f0,'\"');
  std::operator<<((ostream *)&local_5f0,"peer_protection_test");
  std::operator<<((ostream *)&local_5f0,"\" fixture teardown");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_5f0);
  local_670 = (pbVar3->_M_dataplus)._M_p;
  local_668 = local_670 + pbVar3->_M_string_length;
  file_02.m_end = (iterator)0x3e;
  file_02.m_begin = (iterator)&local_660;
  msg_02.m_end = in_R9;
  msg_02.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_02,(size_t)&local_670,msg_02);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_5f0);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_680 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_eviction_tests.cpp"
  ;
  local_678 = "";
  memset(&local_5f0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_5f0);
  std::operator<<((ostream *)&local_5f0,'\"');
  std::operator<<((ostream *)&local_5f0,"peer_protection_test");
  std::operator<<((ostream *)&local_5f0,"\" fixture dtor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_5f0);
  local_690 = (pbVar3->_M_dataplus)._M_p;
  local_688 = local_690 + pbVar3->_M_string_length;
  file_03.m_end = (iterator)0x3e;
  file_03.m_begin = (iterator)&local_680;
  msg_03.m_end = in_R9;
  msg_03.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_03,(size_t)&local_690,msg_03);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_5f0);
  BasicTestingSetup::~BasicTestingSetup(&t.super_BOOST_AUTO_TEST_CASE_FIXTURE);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(peer_protection_test)
{
    FastRandomContext random_context{true};
    int num_peers{12};

    // Expect half of the peers with greatest uptime (the lowest m_connected)
    // to be protected from eviction.
    BOOST_CHECK(IsProtected(
        num_peers, [](NodeEvictionCandidate& c) {
            c.m_connected = std::chrono::seconds{c.id};
            c.m_is_local = false;
            c.m_network = NET_IPV4;
        },
        /*protected_peer_ids=*/{0, 1, 2, 3, 4, 5},
        /*unprotected_peer_ids=*/{6, 7, 8, 9, 10, 11},
        random_context));

    // Verify in the opposite direction.
    BOOST_CHECK(IsProtected(
        num_peers, [num_peers](NodeEvictionCandidate& c) {
            c.m_connected = std::chrono::seconds{num_peers - c.id};
            c.m_is_local = false;
            c.m_network = NET_IPV6;
        },
        /*protected_peer_ids=*/{6, 7, 8, 9, 10, 11},
        /*unprotected_peer_ids=*/{0, 1, 2, 3, 4, 5},
        random_context));

    // Test protection of onion, localhost, and I2P peers...

    // Expect 1/4 onion peers to be protected from eviction,
    // if no localhost, I2P, or CJDNS peers.
    BOOST_CHECK(IsProtected(
        num_peers, [](NodeEvictionCandidate& c) {
            c.m_is_local = false;
            c.m_network = (c.id == 3 || c.id == 8 || c.id == 9) ? NET_ONION : NET_IPV4;
        },
        /*protected_peer_ids=*/{3, 8, 9},
        /*unprotected_peer_ids=*/{},
        random_context));

    // Expect 1/4 onion peers and 1/4 of the other peers to be protected,
    // sorted by longest uptime (lowest m_connected), if no localhost, I2P or CJDNS peers.
    BOOST_CHECK(IsProtected(
        num_peers, [](NodeEvictionCandidate& c) {
            c.m_connected = std::chrono::seconds{c.id};
            c.m_is_local = false;
            c.m_network = (c.id == 3 || c.id > 7) ? NET_ONION : NET_IPV6;
        },
        /*protected_peer_ids=*/{0, 1, 2, 3, 8, 9},
        /*unprotected_peer_ids=*/{4, 5, 6, 7, 10, 11},
        random_context));

    // Expect 1/4 localhost peers to be protected from eviction,
    // if no onion, I2P, or CJDNS peers.
    BOOST_CHECK(IsProtected(
        num_peers, [](NodeEvictionCandidate& c) {
            c.m_is_local = (c.id == 1 || c.id == 9 || c.id == 11);
            c.m_network = NET_IPV4;
        },
        /*protected_peer_ids=*/{1, 9, 11},
        /*unprotected_peer_ids=*/{},
        random_context));

    // Expect 1/4 localhost peers and 1/4 of the other peers to be protected,
    // sorted by longest uptime (lowest m_connected), if no onion, I2P, or CJDNS peers.
    BOOST_CHECK(IsProtected(
        num_peers, [](NodeEvictionCandidate& c) {
            c.m_connected = std::chrono::seconds{c.id};
            c.m_is_local = (c.id > 6);
            c.m_network = NET_IPV6;
        },
        /*protected_peer_ids=*/{0, 1, 2, 7, 8, 9},
        /*unprotected_peer_ids=*/{3, 4, 5, 6, 10, 11},
        random_context));

    // Expect 1/4 I2P peers to be protected from eviction,
    // if no onion, localhost, or CJDNS peers.
    BOOST_CHECK(IsProtected(
        num_peers, [](NodeEvictionCandidate& c) {
            c.m_is_local = false;
            c.m_network = (c.id == 2 || c.id == 7 || c.id == 10) ? NET_I2P : NET_IPV4;
        },
        /*protected_peer_ids=*/{2, 7, 10},
        /*unprotected_peer_ids=*/{},
        random_context));

    // Expect 1/4 I2P peers and 1/4 of the other peers to be protected, sorted
    // by longest uptime (lowest m_connected), if no onion, localhost, or CJDNS peers.
    BOOST_CHECK(IsProtected(
        num_peers, [](NodeEvictionCandidate& c) {
            c.m_connected = std::chrono::seconds{c.id};
            c.m_is_local = false;
            c.m_network = (c.id == 4 || c.id > 8) ? NET_I2P : NET_IPV6;
        },
        /*protected_peer_ids=*/{0, 1, 2, 4, 9, 10},
        /*unprotected_peer_ids=*/{3, 5, 6, 7, 8, 11},
        random_context));

    // Expect 1/4 CJDNS peers to be protected from eviction,
    // if no onion, localhost, or I2P peers.
    BOOST_CHECK(IsProtected(
        num_peers, [](NodeEvictionCandidate& c) {
            c.m_is_local = false;
            c.m_network = (c.id == 2 || c.id == 7 || c.id == 10) ? NET_CJDNS : NET_IPV4;
        },
        /*protected_peer_ids=*/{2, 7, 10},
        /*unprotected_peer_ids=*/{},
        random_context));

    // Expect 1/4 CJDNS peers and 1/4 of the other peers to be protected, sorted
    // by longest uptime (lowest m_connected), if no onion, localhost, or I2P peers.
    BOOST_CHECK(IsProtected(
        num_peers, [](NodeEvictionCandidate& c) {
            c.m_connected = std::chrono::seconds{c.id};
            c.m_is_local = false;
            c.m_network = (c.id == 4 || c.id > 8) ? NET_CJDNS : NET_IPV6;
        },
        /*protected_peer_ids=*/{0, 1, 2, 4, 9, 10},
        /*unprotected_peer_ids=*/{3, 5, 6, 7, 8, 11},
        random_context));

    // Tests with 2 networks...

    // Combined test: expect having 1 localhost and 1 onion peer out of 4 to
    // protect 1 localhost, 0 onion and 1 other peer, sorted by longest uptime;
    // stable sort breaks tie with array order of localhost first.
    BOOST_CHECK(IsProtected(
        4, [](NodeEvictionCandidate& c) {
            c.m_connected = std::chrono::seconds{c.id};
            c.m_is_local = (c.id == 4);
            c.m_network = (c.id == 3) ? NET_ONION : NET_IPV4;
        },
        /*protected_peer_ids=*/{0, 4},
        /*unprotected_peer_ids=*/{1, 2},
        random_context));

    // Combined test: expect having 1 localhost and 1 onion peer out of 7 to
    // protect 1 localhost, 0 onion, and 2 other peers (3 total), sorted by
    // uptime; stable sort breaks tie with array order of localhost first.
    BOOST_CHECK(IsProtected(
        7, [](NodeEvictionCandidate& c) {
            c.m_connected = std::chrono::seconds{c.id};
            c.m_is_local = (c.id == 6);
            c.m_network = (c.id == 5) ? NET_ONION : NET_IPV4;
        },
        /*protected_peer_ids=*/{0, 1, 6},
        /*unprotected_peer_ids=*/{2, 3, 4, 5},
        random_context));

    // Combined test: expect having 1 localhost and 1 onion peer out of 8 to
    // protect protect 1 localhost, 1 onion and 2 other peers (4 total), sorted
    // by uptime; stable sort breaks tie with array order of localhost first.
    BOOST_CHECK(IsProtected(
        8, [](NodeEvictionCandidate& c) {
            c.m_connected = std::chrono::seconds{c.id};
            c.m_is_local = (c.id == 6);
            c.m_network = (c.id == 5) ? NET_ONION : NET_IPV4;
        },
        /*protected_peer_ids=*/{0, 1, 5, 6},
        /*unprotected_peer_ids=*/{2, 3, 4, 7},
        random_context));

    // Combined test: expect having 3 localhost and 3 onion peers out of 12 to
    // protect 2 localhost and 1 onion, plus 3 other peers, sorted by longest
    // uptime; stable sort breaks ties with the array order of localhost first.
    BOOST_CHECK(IsProtected(
        num_peers, [](NodeEvictionCandidate& c) {
            c.m_connected = std::chrono::seconds{c.id};
            c.m_is_local = (c.id == 6 || c.id == 9 || c.id == 11);
            c.m_network = (c.id == 7 || c.id == 8 || c.id == 10) ? NET_ONION : NET_IPV6;
        },
        /*protected_peer_ids=*/{0, 1, 2, 6, 7, 9},
        /*unprotected_peer_ids=*/{3, 4, 5, 8, 10, 11},
        random_context));

    // Combined test: expect having 4 localhost and 1 onion peer out of 12 to
    // protect 2 localhost and 1 onion, plus 3 other peers, sorted by longest uptime.
    BOOST_CHECK(IsProtected(
        num_peers, [](NodeEvictionCandidate& c) {
            c.m_connected = std::chrono::seconds{c.id};
            c.m_is_local = (c.id > 4 && c.id < 9);
            c.m_network = (c.id == 10) ? NET_ONION : NET_IPV4;
        },
        /*protected_peer_ids=*/{0, 1, 2, 5, 6, 10},
        /*unprotected_peer_ids=*/{3, 4, 7, 8, 9, 11},
        random_context));

    // Combined test: expect having 4 localhost and 2 onion peers out of 16 to
    // protect 2 localhost and 2 onions, plus 4 other peers, sorted by longest uptime.
    BOOST_CHECK(IsProtected(
        16, [](NodeEvictionCandidate& c) {
            c.m_connected = std::chrono::seconds{c.id};
            c.m_is_local = (c.id == 6 || c.id == 9 || c.id == 11 || c.id == 12);
            c.m_network = (c.id == 8 || c.id == 10) ? NET_ONION : NET_IPV6;
        },
        /*protected_peer_ids=*/{0, 1, 2, 3, 6, 8, 9, 10},
        /*unprotected_peer_ids=*/{4, 5, 7, 11, 12, 13, 14, 15},
        random_context));

    // Combined test: expect having 5 localhost and 1 onion peer out of 16 to
    // protect 3 localhost (recovering the unused onion slot), 1 onion, and 4
    // others, sorted by longest uptime.
    BOOST_CHECK(IsProtected(
        16, [](NodeEvictionCandidate& c) {
            c.m_connected = std::chrono::seconds{c.id};
            c.m_is_local = (c.id > 10);
            c.m_network = (c.id == 10) ? NET_ONION : NET_IPV4;
        },
        /*protected_peer_ids=*/{0, 1, 2, 3, 10, 11, 12, 13},
        /*unprotected_peer_ids=*/{4, 5, 6, 7, 8, 9, 14, 15},
        random_context));

    // Combined test: expect having 1 localhost and 4 onion peers out of 16 to
    // protect 1 localhost and 3 onions (recovering the unused localhost slot),
    // plus 4 others, sorted by longest uptime.
    BOOST_CHECK(IsProtected(
        16, [](NodeEvictionCandidate& c) {
            c.m_connected = std::chrono::seconds{c.id};
            c.m_is_local = (c.id == 15);
            c.m_network = (c.id > 6 && c.id < 11) ? NET_ONION : NET_IPV6;
        },
        /*protected_peer_ids=*/{0, 1, 2, 3, 7, 8, 9, 15},
        /*unprotected_peer_ids=*/{5, 6, 10, 11, 12, 13, 14},
        random_context));

    // Combined test: expect having 2 onion and 4 I2P out of 12 peers to protect
    // 2 onion (prioritized for having fewer candidates) and 1 I2P, plus 3
    // others, sorted by longest uptime.
    BOOST_CHECK(IsProtected(
        num_peers, [](NodeEvictionCandidate& c) {
            c.m_connected = std::chrono::seconds{c.id};
            c.m_is_local = false;
            if (c.id == 8 || c.id == 10) {
                c.m_network = NET_ONION;
            } else if (c.id == 6 || c.id == 9 || c.id == 11 || c.id == 12) {
                c.m_network = NET_I2P;
            } else {
                c.m_network = NET_IPV4;
            }
        },
        /*protected_peer_ids=*/{0, 1, 2, 6, 8, 10},
        /*unprotected_peer_ids=*/{3, 4, 5, 7, 9, 11},
        random_context));

    // Tests with 3 networks...

    // Combined test: expect having 1 localhost, 1 I2P and 1 onion peer out of 4
    // to protect 1 I2P, 0 localhost, 0 onion and 1 other peer (2 total), sorted
    // by longest uptime; stable sort breaks tie with array order of I2P first.
    BOOST_CHECK(IsProtected(
        4, [](NodeEvictionCandidate& c) {
            c.m_connected = std::chrono::seconds{c.id};
            c.m_is_local = (c.id == 2);
            if (c.id == 3) {
                c.m_network = NET_I2P;
            } else if (c.id == 1) {
                c.m_network = NET_ONION;
            } else {
                c.m_network = NET_IPV6;
            }
        },
        /*protected_peer_ids=*/{0, 3},
        /*unprotected_peer_ids=*/{1, 2},
        random_context));

    // Combined test: expect having 1 localhost, 1 I2P and 1 onion peer out of 7
    // to protect 1 I2P, 0 localhost, 0 onion and 2 other peers (3 total) sorted
    // by longest uptime; stable sort breaks tie with array order of I2P first.
    BOOST_CHECK(IsProtected(
        7, [](NodeEvictionCandidate& c) {
            c.m_connected = std::chrono::seconds{c.id};
            c.m_is_local = (c.id == 4);
            if (c.id == 6) {
                c.m_network = NET_I2P;
            } else if (c.id == 5) {
                c.m_network = NET_ONION;
            } else {
                c.m_network = NET_IPV6;
            }
        },
        /*protected_peer_ids=*/{0, 1, 6},
        /*unprotected_peer_ids=*/{2, 3, 4, 5},
        random_context));

    // Combined test: expect having 1 localhost, 1 I2P and 1 onion peer out of 8
    // to protect 1 I2P, 1 localhost, 0 onion and 2 other peers (4 total) sorted
    // by uptime; stable sort breaks tie with array order of I2P then localhost.
    BOOST_CHECK(IsProtected(
        8, [](NodeEvictionCandidate& c) {
            c.m_connected = std::chrono::seconds{c.id};
            c.m_is_local = (c.id == 6);
            if (c.id == 5) {
                c.m_network = NET_I2P;
            } else if (c.id == 4) {
                c.m_network = NET_ONION;
            } else {
                c.m_network = NET_IPV6;
            }
        },
        /*protected_peer_ids=*/{0, 1, 5, 6},
        /*unprotected_peer_ids=*/{2, 3, 4, 7},
        random_context));

    // Combined test: expect having 4 localhost, 2 I2P, and 2 onion peers out of
    // 16 to protect 1 localhost, 2 I2P, and 1 onion (4/16 total), plus 4 others
    // for 8 total, sorted by longest uptime.
    BOOST_CHECK(IsProtected(
        16, [](NodeEvictionCandidate& c) {
            c.m_connected = std::chrono::seconds{c.id};
            c.m_is_local = (c.id == 6 || c.id > 11);
            if (c.id == 7 || c.id == 11) {
                c.m_network = NET_I2P;
            } else if (c.id == 9 || c.id == 10) {
                c.m_network = NET_ONION;
            } else {
                c.m_network = NET_IPV4;
            }
        },
        /*protected_peer_ids=*/{0, 1, 2, 3, 6, 7, 9, 11},
        /*unprotected_peer_ids=*/{4, 5, 8, 10, 12, 13, 14, 15},
        random_context));

    // Combined test: expect having 1 localhost, 8 I2P and 1 onion peer out of
    // 24 to protect 1, 4, and 1 (6 total), plus 6 others for 12/24 total,
    // sorted by longest uptime.
    BOOST_CHECK(IsProtected(
        24, [](NodeEvictionCandidate& c) {
            c.m_connected = std::chrono::seconds{c.id};
            c.m_is_local = (c.id == 12);
            if (c.id > 14 && c.id < 23) { // 4 protected instead of usual 2
                c.m_network = NET_I2P;
            } else if (c.id == 23) {
                c.m_network = NET_ONION;
            } else {
                c.m_network = NET_IPV6;
            }
        },
        /*protected_peer_ids=*/{0, 1, 2, 3, 4, 5, 12, 15, 16, 17, 18, 23},
        /*unprotected_peer_ids=*/{6, 7, 8, 9, 10, 11, 13, 14, 19, 20, 21, 22},
        random_context));

    // Combined test: expect having 1 localhost, 3 I2P and 6 onion peers out of
    // 24 to protect 1, 3, and 2 (6 total, I2P has fewer candidates and so gets the
    // unused localhost slot), plus 6 others for 12/24 total, sorted by longest uptime.
    BOOST_CHECK(IsProtected(
        24, [](NodeEvictionCandidate& c) {
            c.m_connected = std::chrono::seconds{c.id};
            c.m_is_local = (c.id == 15);
            if (c.id == 12 || c.id == 14 || c.id == 17) {
                c.m_network = NET_I2P;
            } else if (c.id > 17) { // 4 protected instead of usual 2
                c.m_network = NET_ONION;
            } else {
                c.m_network = NET_IPV4;
            }
        },
        /*protected_peer_ids=*/{0, 1, 2, 3, 4, 5, 12, 14, 15, 17, 18, 19},
        /*unprotected_peer_ids=*/{6, 7, 8, 9, 10, 11, 13, 16, 20, 21, 22, 23},
        random_context));

    // Combined test: expect having 1 localhost, 7 I2P and 4 onion peers out of
    // 24 to protect 1 localhost, 2 I2P, and 3 onions (6 total), plus 6 others
    // for 12/24 total, sorted by longest uptime.
    BOOST_CHECK(IsProtected(
        24, [](NodeEvictionCandidate& c) {
            c.m_connected = std::chrono::seconds{c.id};
            c.m_is_local = (c.id == 13);
            if (c.id > 16) {
                c.m_network = NET_I2P;
            } else if (c.id == 12 || c.id == 14 || c.id == 15 || c.id == 16) {
                c.m_network = NET_ONION;
            } else {
                c.m_network = NET_IPV6;
            }
        },
        /*protected_peer_ids=*/{0, 1, 2, 3, 4, 5, 12, 13, 14, 15, 17, 18},
        /*unprotected_peer_ids=*/{6, 7, 8, 9, 10, 11, 16, 19, 20, 21, 22, 23},
        random_context));

    // Combined test: expect having 8 localhost, 4 CJDNS, and 3 onion peers out
    // of 24 to protect 2 of each (6 total), plus 6 others for 12/24 total,
    // sorted by longest uptime.
    BOOST_CHECK(IsProtected(
        24, [](NodeEvictionCandidate& c) {
            c.m_connected = std::chrono::seconds{c.id};
            c.m_is_local = (c.id > 15);
            if (c.id > 10 && c.id < 15) {
                c.m_network = NET_CJDNS;
            } else if (c.id > 6 && c.id < 10) {
                c.m_network = NET_ONION;
            } else {
                c.m_network = NET_IPV4;
            }
        },
        /*protected_peer_ids=*/{0, 1, 2, 3, 4, 5, 7, 8, 11, 12, 16, 17},
        /*unprotected_peer_ids=*/{6, 9, 10, 13, 14, 15, 18, 19, 20, 21, 22, 23},
        random_context));

    // Tests with 4 networks...

    // Combined test: expect having 1 CJDNS, 1 I2P, 1 localhost and 1 onion peer
    // out of 5 to protect 1 CJDNS, 0 I2P, 0 localhost, 0 onion and 1 other peer
    // (2 total), sorted by longest uptime; stable sort breaks tie with array
    // order of CJDNS first.
    BOOST_CHECK(IsProtected(
        5, [](NodeEvictionCandidate& c) {
            c.m_connected = std::chrono::seconds{c.id};
            c.m_is_local = (c.id == 3);
            if (c.id == 4) {
                c.m_network = NET_CJDNS;
            } else if (c.id == 1) {
                c.m_network = NET_I2P;
            } else if (c.id == 2) {
                c.m_network = NET_ONION;
            } else {
                c.m_network = NET_IPV6;
            }
        },
        /*protected_peer_ids=*/{0, 4},
        /*unprotected_peer_ids=*/{1, 2, 3},
        random_context));

    // Combined test: expect having 1 CJDNS, 1 I2P, 1 localhost and 1 onion peer
    // out of 7 to protect 1 CJDNS, 0, I2P, 0 localhost, 0 onion and 2 other
    // peers (3 total) sorted by longest uptime; stable sort breaks tie with
    // array order of CJDNS first.
    BOOST_CHECK(IsProtected(
        7, [](NodeEvictionCandidate& c) {
            c.m_connected = std::chrono::seconds{c.id};
            c.m_is_local = (c.id == 4);
            if (c.id == 6) {
                c.m_network = NET_CJDNS;
            } else if (c.id == 5) {
                c.m_network = NET_I2P;
            } else if (c.id == 3) {
                c.m_network = NET_ONION;
            } else {
                c.m_network = NET_IPV4;
            }
        },
        /*protected_peer_ids=*/{0, 1, 6},
        /*unprotected_peer_ids=*/{2, 3, 4, 5},
        random_context));

    // Combined test: expect having 1 CJDNS, 1 I2P, 1 localhost and 1 onion peer
    // out of 8 to protect 1 CJDNS, 1 I2P, 0 localhost, 0 onion and 2 other
    // peers (4 total) sorted by longest uptime; stable sort breaks tie with
    // array order of CJDNS first.
    BOOST_CHECK(IsProtected(
        8, [](NodeEvictionCandidate& c) {
            c.m_connected = std::chrono::seconds{c.id};
            c.m_is_local = (c.id == 3);
            if (c.id == 5) {
                c.m_network = NET_CJDNS;
            } else if (c.id == 6) {
                c.m_network = NET_I2P;
            } else if (c.id == 3) {
                c.m_network = NET_ONION;
            } else {
                c.m_network = NET_IPV6;
            }
        },
        /*protected_peer_ids=*/{0, 1, 5, 6},
        /*unprotected_peer_ids=*/{2, 3, 4, 7},
        random_context));

    // Combined test: expect having 2 CJDNS, 2 I2P, 4 localhost, and 2 onion
    // peers out of 16 to protect 1 CJDNS, 1 I2P, 1 localhost, 1 onion (4/16
    // total), plus 4 others for 8 total, sorted by longest uptime.
    BOOST_CHECK(IsProtected(
        16, [](NodeEvictionCandidate& c) {
            c.m_connected = std::chrono::seconds{c.id};
            c.m_is_local = (c.id > 5);
            if (c.id == 11 || c.id == 15) {
                c.m_network = NET_CJDNS;
            } else if (c.id == 10 || c.id == 14) {
                c.m_network = NET_I2P;
            } else if (c.id == 8 || c.id == 9) {
                c.m_network = NET_ONION;
            } else {
                c.m_network = NET_IPV4;
            }
        },
        /*protected_peer_ids=*/{0, 1, 2, 3, 6, 8, 10, 11},
        /*unprotected_peer_ids=*/{4, 5, 7, 9, 12, 13, 14, 15},
        random_context));

    // Combined test: expect having 6 CJDNS, 1 I2P, 1 localhost, and 4 onion
    // peers out of 24 to protect 2 CJDNS, 1 I2P, 1 localhost, and 2 onions (6
    // total), plus 6 others for 12/24 total, sorted by longest uptime.
    BOOST_CHECK(IsProtected(
        24, [](NodeEvictionCandidate& c) {
            c.m_connected = std::chrono::seconds{c.id};
            c.m_is_local = (c.id == 13);
            if (c.id > 17) {
                c.m_network = NET_CJDNS;
            } else if (c.id == 17) {
                c.m_network = NET_I2P;
            } else if (c.id == 12 || c.id == 14 || c.id == 15 || c.id == 16) {
                c.m_network = NET_ONION;
            } else {
                c.m_network = NET_IPV6;
            }
        },
        /*protected_peer_ids=*/{0, 1, 2, 3, 4, 5, 12, 13, 14, 17, 18, 19},
        /*unprotected_peer_ids=*/{6, 7, 8, 9, 10, 11, 15, 16, 20, 21, 22, 23},
        random_context));
}